

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

unsigned_long_long
ImGui::ScaleValueFromRatioT<unsigned_long_long,long_long,double>
          (ImGuiDataType data_type,float t,unsigned_long_long v_min,unsigned_long_long v_max,
          bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  unsigned_long_long uVar1;
  byte in_CL;
  ulong in_RDX;
  unsigned_long_long in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float in_XMM1_Da;
  float in_XMM2_Da;
  double v_new_off_f;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  double v_max_fudged;
  double v_min_fudged;
  bool flipped;
  unsigned_long_long result;
  bool is_decimal;
  double in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  float local_104;
  float local_fc;
  float local_cc;
  float local_c0;
  float local_b8;
  float local_b0;
  float local_ac;
  float local_a4;
  float local_9c;
  double local_98;
  float local_8c;
  float local_84;
  double local_80;
  float local_78;
  float local_70;
  bool local_69;
  double local_50;
  double local_48;
  byte local_39;
  ulong local_38;
  bool local_2d;
  float local_2c;
  float local_28;
  byte local_21;
  ulong local_20;
  ulong local_18;
  float local_10;
  ulong local_8;
  
  local_21 = in_CL & 1;
  local_8 = in_RSI;
  if (in_RSI != in_RDX) {
    local_69 = in_EDI == 8 || in_EDI == 9;
    local_2d = local_69;
    if (local_21 == 0) {
      if (in_EDI == 8 || in_EDI == 9) {
        local_38 = ImLerp<unsigned_long_long>(in_RSI,in_RDX,in_XMM0_Da);
      }
      else {
        local_38 = in_RDX;
        if (in_XMM0_Da < 1.0) {
          fVar2 = -0.5;
          if (in_RSI <= in_RDX) {
            fVar2 = 0.5;
          }
          local_38 = in_RSI + (long)((float)(long)(in_RDX - in_RSI) * in_XMM0_Da + fVar2);
        }
      }
    }
    else {
      local_38 = in_RSI;
      if ((0.0 < in_XMM0_Da) && (local_38 = in_RDX, in_XMM0_Da < 1.0)) {
        local_39 = in_RDX < in_RSI;
        auVar5._8_4_ = (int)(in_RSI >> 0x20);
        auVar5._0_8_ = in_RSI;
        auVar5._12_4_ = 0x45300000;
        local_2c = in_XMM2_Da;
        local_28 = in_XMM1_Da;
        local_20 = in_RDX;
        local_18 = in_RSI;
        local_10 = in_XMM0_Da;
        dVar3 = ImAbs((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0));
        if ((double)local_28 <= dVar3) {
          auVar6._8_4_ = (int)(local_18 >> 0x20);
          auVar6._0_8_ = local_18;
          auVar6._12_4_ = 0x45300000;
          local_80 = (auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0);
        }
        else {
          local_70 = (float)local_18;
          if (0.0 <= local_70) {
            local_78 = local_28;
          }
          else {
            local_78 = -local_28;
          }
          local_80 = (double)local_78;
        }
        local_48 = local_80;
        auVar7._8_4_ = (int)(local_20 >> 0x20);
        auVar7._0_8_ = local_20;
        auVar7._12_4_ = 0x45300000;
        dVar3 = ImAbs((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0));
        if ((double)local_28 <= dVar3) {
          auVar8._8_4_ = (int)(local_20 >> 0x20);
          auVar8._0_8_ = local_20;
          auVar8._12_4_ = 0x45300000;
          local_98 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0);
        }
        else {
          local_84 = (float)local_20;
          if (0.0 <= local_84) {
            local_8c = local_28;
          }
          else {
            local_8c = -local_28;
          }
          local_98 = (double)local_8c;
        }
        local_50 = local_98;
        if ((local_39 & 1) != 0) {
          ImSwap<double>(&local_48,&local_50);
        }
        dVar3 = local_48;
        local_9c = (float)local_20;
        if (((local_9c == 0.0) && (!NAN(local_9c))) && (local_a4 = (float)local_18, local_a4 < 0.0))
        {
          local_50 = (double)-local_28;
        }
        dVar4 = local_50;
        if ((local_39 & 1) == 0) {
          local_ac = local_10;
        }
        else {
          local_ac = 1.0 - local_10;
        }
        local_b0 = (float)(local_18 * local_20);
        if (0.0 <= local_b0) {
          local_fc = (float)local_18;
          if ((local_fc < 0.0) || (local_104 = (float)local_20, local_104 < 0.0)) {
            dVar3 = ImPow(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            local_38 = (ulong)(dVar4 * dVar3);
            local_38 = local_38 |
                       (long)(dVar4 * dVar3 - 9.223372036854776e+18) & (long)local_38 >> 0x3f;
          }
          else {
            dVar4 = ImPow(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            local_38 = (ulong)(dVar3 * dVar4);
            local_38 = local_38 |
                       (long)(dVar3 * dVar4 - 9.223372036854776e+18) & (long)local_38 >> 0x3f;
          }
        }
        else {
          uVar1 = ImMin<unsigned_long_long>(local_18,local_20);
          local_b8 = (float)uVar1;
          local_c0 = (float)local_20;
          local_cc = (float)local_18;
          fVar2 = ImAbs(local_c0 - local_cc);
          fVar2 = -local_b8 / fVar2;
          if ((local_ac < fVar2 - local_2c) || (fVar2 + local_2c < local_ac)) {
            if (fVar2 <= local_ac) {
              dVar3 = ImPow(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
              local_38 = (ulong)((double)local_28 * dVar3);
              local_38 = local_38 |
                         (long)((double)local_28 * dVar3 - 9.223372036854776e+18) &
                         (long)local_38 >> 0x3f;
            }
            else {
              dVar3 = ImPow(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
              local_38 = (ulong)-((double)local_28 * dVar3);
              local_38 = local_38 |
                         (long)(-((double)local_28 * dVar3) - 9.223372036854776e+18) &
                         (long)local_38 >> 0x3f;
            }
          }
          else {
            local_38 = 0;
          }
        }
      }
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}